

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quest.cpp
# Opt level: O0

void __thiscall Quest_Context::KilledPlayer(Quest_Context *this)

{
  bool bVar1;
  mapped_type *pmVar2;
  allocator<char> local_e9;
  key_type local_e8;
  anon_class_2_1_4cde4196 local_c2;
  function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)> local_c0;
  allocator<char> local_99;
  string local_98;
  allocator<char> local_71;
  key_type local_70;
  short local_4e;
  short amount;
  allocator<char> local_39;
  string local_38;
  undefined1 local_11;
  Quest_Context *pQStack_10;
  bool check;
  Quest_Context *this_local;
  
  pQStack_10 = this;
  bVar1 = Quest::Disabled(this->quest);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"killedplayers",&local_39);
    bVar1 = EOPlus::Context::QueryRule(&this->super_Context,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::allocator<char>::~allocator(&local_39);
    local_4e = 0;
    local_11 = bVar1;
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"killedplayers",&local_71);
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
               ::operator[](&this->progress,&local_70);
      local_4e = *pmVar2 + 1;
      *pmVar2 = local_4e;
      std::__cxx11::string::~string((string *)&local_70);
      std::allocator<char>::~allocator(&local_71);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_98,"killedplayers",&local_99);
    local_c2.amount = local_4e;
    std::function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)>::
    function<Quest_Context::KilledPlayer()::__0,void>
              ((function<bool(std::deque<util::variant,std::allocator<util::variant>>const&)> *)
               &local_c0,&local_c2);
    bVar1 = EOPlus::Context::TriggerRule(&this->super_Context,&local_98,&local_c0);
    std::function<bool_(const_std::deque<util::variant,_std::allocator<util::variant>_>_&)>::
    ~function(&local_c0);
    std::__cxx11::string::~string((string *)&local_98);
    std::allocator<char>::~allocator(&local_99);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_e8,"killedplayers",&local_e9);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_short>_>_>
      ::erase(&this->progress,&local_e8);
      std::__cxx11::string::~string((string *)&local_e8);
      std::allocator<char>::~allocator(&local_e9);
    }
  }
  return;
}

Assistant:

void Quest_Context::KilledPlayer()
{
	if (this->quest->Disabled())
		return;

	bool check = this->QueryRule("killedplayers");
	short amount = 0;

	if (check)
		amount = ++this->progress["killedplayers"];

	if (this->TriggerRule("killedplayers", [amount](const std::deque<util::variant>& args) { return amount >= int(args[0]); }))
		this->progress.erase("killedplayers");
}